

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O3

int luaB_error(lua_State *L)

{
  int iVar1;
  lua_Integer lVar2;
  
  lVar2 = luaL_optinteger(L,2,1);
  lua_settop(L,1);
  iVar1 = lua_type(L,1);
  if ((0 < (int)lVar2) && (iVar1 == 4)) {
    luaL_where(L,(int)lVar2);
    lua_pushvalue(L,1);
    lua_concat(L,2);
  }
  iVar1 = lua_error(L);
  return iVar1;
}

Assistant:

static int luaB_error (lua_State *L) {
  int level = (int)luaL_optinteger(L, 2, 1);
  lua_settop(L, 1);
  if (lua_type(L, 1) == LUA_TSTRING && level > 0) {
    luaL_where(L, level);   /* add extra information */
    lua_pushvalue(L, 1);
    lua_concat(L, 2);
  }
  return lua_error(L);
}